

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICrashX.cpp
# Opt level: O2

HighsStatus
callCrossover(HighsOptions *options,HighsLp *lp,HighsBasis *highs_basis,
             HighsSolution *highs_solution,HighsModelStatus *model_status,HighsInfo *highs_info,
             HighsCallback *highs_callback)

{
  HighsInt *pHVar1;
  double dVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  Parameters new_parameters;
  Int IVar6;
  uint uVar7;
  HighsStatus HVar8;
  long lVar9;
  ulong uVar10;
  HighsLogOptions *log_options_;
  uint *puVar11;
  undefined8 *puVar12;
  ulong uVar13;
  ulong uVar14;
  pointer z_start;
  pointer y_start;
  byte bVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  double dVar18;
  undefined1 in_stack_ffffffffffffeef8 [184];
  undefined8 uVar19;
  vector<double,_std::allocator<double>_> *col_ub_00;
  vector<int,_std::allocator<int>_> *Ap_00;
  vector<int,_std::allocator<int>_> *Ai_00;
  vector<double,_std::allocator<double>_> *Ax;
  vector<double,_std::allocator<double>_> *rhs_00;
  HighsLogOptions *pHVar20;
  Int num_row;
  Int num_col;
  HighsBasis *local_1010;
  HighsModelStatus *local_1008;
  HighsInfo *local_1000;
  vector<char,_std::allocator<char>_> constraint_type;
  vector<double,_std::allocator<double>_> rhs;
  vector<double,_std::allocator<double>_> slack;
  vector<double,_std::allocator<double>_> x;
  double offset;
  vector<double,_std::allocator<double>_> Av;
  vector<double,_std::allocator<double>_> col_ub;
  vector<double,_std::allocator<double>_> col_lb;
  vector<int,_std::allocator<int>_> Ai;
  vector<int,_std::allocator<int>_> Ap;
  vector<double,_std::allocator<double>_> objective;
  IpxSolution ipx_solution;
  Info ipx_info;
  uint local_c50 [2];
  undefined8 local_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined1 local_c30;
  undefined8 local_c2c;
  undefined4 local_c24;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 local_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined4 local_bf8;
  undefined8 local_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined4 local_bd8;
  undefined8 local_bd0;
  undefined4 local_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 local_bb0;
  int local_ba8;
  undefined8 local_ba4;
  undefined8 uStack_b9c;
  undefined8 local_b94;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined4 local_b70;
  undefined1 local_b6c;
  HighsLogOptions *local_b68;
  LpSolver lps;
  
  bVar15 = 0;
  Ap_00 = &Ap;
  Ap.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  Ai_00 = &Ai;
  Ai.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  Ap.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  Ap.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  Ai.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  Ai.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  objective.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  objective.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  objective.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  col_lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  col_lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  col_lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  col_ub_00 = &col_ub;
  col_ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Ax = &Av;
  Av.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  col_ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  col_ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  Av.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  Av.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  rhs_00 = &rhs;
  rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  constraint_type.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  constraint_type.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  constraint_type.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar19 = 0x31f308;
  local_1010 = highs_basis;
  local_1008 = model_status;
  local_1000 = highs_info;
  fillInIpxData(lp,&num_col,&num_row,&offset,&objective,&col_lb,col_ub_00,Ap_00,Ai_00,Ax,rhs_00,
                &constraint_type);
  bVar3 = (options->super_HighsOptionsStruct).output_flag;
  iVar5 = (options->super_HighsOptionsStruct).log_dev_level;
  ipx::LpSolver::LpSolver(&lps);
  log_options_ = &(options->super_HighsOptionsStruct).log_options;
  HVar8 = kWarning;
  pHVar20 = (HighsLogOptions *)0x4;
  local_ba8 = 4;
  if (iVar5 != 3) {
    local_ba8 = (uint)(iVar5 == 1) * 2;
  }
  local_c50[0] = (uint)bVar3;
  local_c48 = 0;
  local_c40 = 0x4014000000000000;
  uStack_c38 = 0xbff0000000000000;
  local_c30 = 0;
  local_c2c = 0x1ffffffff;
  local_c24 = 300;
  local_c20 = 0x3eb0c6f7a0b5ed8d;
  uStack_c18 = 0x3e45798ee2308c3a;
  local_c10 = 0x3e112e0be826d695;
  uStack_c08 = 0x3e112e0be826d695;
  local_c00 = 0x3fd3333333333333;
  local_bf8 = 1;
  local_bf0 = 0x3eb0c6f7a0b5ed8d;
  uStack_be8 = 0x4000000000000000;
  local_be0 = 0xa00002710;
  local_bd8 = 0;
  local_bd0 = 0x3fb0000000000000;
  local_bc8 = 1;
  local_bc0 = 0x3e45798ee2308c3a;
  uStack_bb8 = 0x3e7ad7f29abcaf48;
  local_bb0 = 0x3e7ad7f29abcaf48;
  local_ba4 = 0xffffffff;
  uStack_b9c = 0xffffffff00000001;
  local_b94 = 0x500000000;
  local_b88 = 0x4059000000000000;
  uStack_b80 = 0x3ff8000000000000;
  local_b78 = 0x3fe0000000000000;
  local_b70 = 3;
  local_b6c = 1;
  local_b68 = log_options_;
  puVar11 = local_c50;
  puVar12 = (undefined8 *)&stack0xffffffffffffeef8;
  for (lVar9 = 0x1e; lVar9 != 0; lVar9 = lVar9 + -1) {
    *puVar12 = *(undefined8 *)puVar11;
    puVar11 = puVar11 + ((ulong)bVar15 * -2 + 1) * 2;
    puVar12 = puVar12 + (ulong)bVar15 * -2 + 1;
  }
  new_parameters.super_ipx_parameters.maxpasses = (int)uVar19;
  new_parameters.super_ipx_parameters.run_centring = (int)((ulong)uVar19 >> 0x20);
  new_parameters.super_ipx_parameters.display = in_stack_ffffffffffffeef8._0_4_;
  new_parameters.super_ipx_parameters._4_4_ = in_stack_ffffffffffffeef8._4_4_;
  new_parameters.super_ipx_parameters.logfile = (char *)in_stack_ffffffffffffeef8._8_8_;
  new_parameters.super_ipx_parameters.print_interval = (double)in_stack_ffffffffffffeef8._16_8_;
  new_parameters.super_ipx_parameters.time_limit = (double)in_stack_ffffffffffffeef8._24_8_;
  new_parameters.super_ipx_parameters.analyse_basis_data = (bool)in_stack_ffffffffffffeef8[0x20];
  new_parameters.super_ipx_parameters._33_3_ = in_stack_ffffffffffffeef8._33_3_;
  new_parameters.super_ipx_parameters.dualize = in_stack_ffffffffffffeef8._36_4_;
  new_parameters.super_ipx_parameters.scale = in_stack_ffffffffffffeef8._40_4_;
  new_parameters.super_ipx_parameters.ipm_maxiter = in_stack_ffffffffffffeef8._44_4_;
  new_parameters.super_ipx_parameters.ipm_feasibility_tol = (double)in_stack_ffffffffffffeef8._48_8_
  ;
  new_parameters.super_ipx_parameters.ipm_optimality_tol = (double)in_stack_ffffffffffffeef8._56_8_;
  new_parameters.super_ipx_parameters.ipm_drop_primal = (double)in_stack_ffffffffffffeef8._64_8_;
  new_parameters.super_ipx_parameters.ipm_drop_dual = (double)in_stack_ffffffffffffeef8._72_8_;
  new_parameters.super_ipx_parameters.kkt_tol = (double)in_stack_ffffffffffffeef8._80_8_;
  new_parameters.super_ipx_parameters.crash_basis = in_stack_ffffffffffffeef8._88_4_;
  new_parameters.super_ipx_parameters._92_4_ = in_stack_ffffffffffffeef8._92_4_;
  new_parameters.super_ipx_parameters.dependency_tol = (double)in_stack_ffffffffffffeef8._96_8_;
  new_parameters.super_ipx_parameters.volume_tol = (double)in_stack_ffffffffffffeef8._104_8_;
  new_parameters.super_ipx_parameters.rows_per_slice = in_stack_ffffffffffffeef8._112_4_;
  new_parameters.super_ipx_parameters.maxskip_updates = in_stack_ffffffffffffeef8._116_4_;
  new_parameters.super_ipx_parameters.lu_kernel = in_stack_ffffffffffffeef8._120_4_;
  new_parameters.super_ipx_parameters._124_4_ = in_stack_ffffffffffffeef8._124_4_;
  new_parameters.super_ipx_parameters.lu_pivottol = (double)in_stack_ffffffffffffeef8._128_8_;
  new_parameters.super_ipx_parameters.run_crossover = in_stack_ffffffffffffeef8._136_4_;
  new_parameters.super_ipx_parameters._140_4_ = in_stack_ffffffffffffeef8._140_4_;
  new_parameters.super_ipx_parameters.start_crossover_tol =
       (double)in_stack_ffffffffffffeef8._144_8_;
  new_parameters.super_ipx_parameters.pfeasibility_tol = (double)in_stack_ffffffffffffeef8._152_8_;
  new_parameters.super_ipx_parameters.dfeasibility_tol = (double)in_stack_ffffffffffffeef8._160_8_;
  new_parameters.super_ipx_parameters.debug = in_stack_ffffffffffffeef8._168_4_;
  new_parameters.super_ipx_parameters.switchiter = in_stack_ffffffffffffeef8._172_4_;
  new_parameters.super_ipx_parameters.stop_at_switch = in_stack_ffffffffffffeef8._176_4_;
  new_parameters.super_ipx_parameters.update_heuristic = in_stack_ffffffffffffeef8._180_4_;
  new_parameters.super_ipx_parameters._192_8_ = col_ub_00;
  new_parameters.super_ipx_parameters.centring_ratio_tolerance = (double)Ap_00;
  new_parameters.super_ipx_parameters.centring_ratio_reduction = (double)Ai_00;
  new_parameters.super_ipx_parameters.centring_alpha_scaling = (double)Ax;
  new_parameters.super_ipx_parameters._224_8_ = rhs_00;
  new_parameters.super_ipx_parameters.log_options = pHVar20;
  ipx::LpSolver::SetParameters(&lps,new_parameters);
  ipx::LpSolver::SetCallback(&lps,highs_callback);
  IVar6 = ipx::LpSolver::LoadModel
                    (&lps,num_col,offset,
                     objective.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     col_lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     col_ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,num_row,
                     Ap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     Ai.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     Av.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     constraint_type.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start);
  if (IVar6 != 0) {
    highsLogUser(log_options_,kError,"Error loading ipx model\n");
    HVar8 = kError;
    goto LAB_0031f8a2;
  }
  std::vector<double,_std::allocator<double>_>::vector(&x,&highs_solution->col_value);
  uVar13 = 0;
  uVar14 = (ulong)(uint)num_col;
  if (num_col < 1) {
    uVar14 = uVar13;
  }
  for (; uVar14 != uVar13; uVar13 = uVar13 + 1) {
    dVar18 = col_lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar13];
    uVar16 = SUB84(dVar18,0);
    uVar17 = (undefined4)((ulong)dVar18 >> 0x20);
    dVar2 = x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar13];
    if (dVar18 <= dVar2) {
      uVar16 = SUB84(dVar2,0);
      uVar17 = (undefined4)((ulong)dVar2 >> 0x20);
    }
    x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [uVar13] = (double)CONCAT44(uVar17,uVar16);
    dVar18 = col_ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar13];
    if ((double)CONCAT44(uVar17,uVar16) <= dVar18) {
      dVar18 = (double)CONCAT44(uVar17,uVar16);
    }
    x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [uVar13] = dVar18;
  }
  std::vector<double,_std::allocator<double>_>::vector(&slack,&rhs);
  uVar13 = 0;
  uVar14 = 0;
  if (0 < num_col) {
    uVar13 = (ulong)(uint)num_col;
  }
  while (uVar10 = uVar14, uVar10 != uVar13) {
    iVar5 = Ap.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar10 + 1];
    for (lVar9 = (long)Ap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar10]; uVar14 = uVar10 + 1, lVar9 < iVar5;
        lVar9 = lVar9 + 1) {
      slack.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[Ai.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar9]] =
           slack.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
           ._M_start[Ai.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar9]] -
           Av.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar9] *
           x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[uVar10];
    }
  }
  uVar14 = 0;
  uVar13 = 0;
  if (0 < num_row) {
    uVar13 = (ulong)(uint)num_row;
  }
  for (; uVar13 != uVar14; uVar14 = uVar14 + 1) {
    cVar4 = constraint_type.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar14];
    if (cVar4 == '<') {
      uVar16 = 0;
      uVar17 = 0;
      dVar18 = slack.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar14];
      if (0.0 <= dVar18) {
        uVar16 = SUB84(dVar18,0);
        uVar17 = (undefined4)((ulong)dVar18 >> 0x20);
      }
LAB_0031f63c:
      slack.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar14] = (double)CONCAT44(uVar17,uVar16);
    }
    else {
      if (cVar4 == '>') {
        uVar16 = 0;
        uVar17 = 0;
        dVar18 = slack.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar14];
        if (dVar18 <= 0.0) {
          uVar16 = SUB84(dVar18,0);
          uVar17 = (undefined4)((ulong)dVar18 >> 0x20);
        }
        goto LAB_0031f63c;
      }
      if (cVar4 == '=') {
        slack.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar14] = 0.0;
      }
    }
  }
  if (((highs_solution->dual_valid == false) ||
      (num_col !=
       (int)((ulong)((long)(highs_solution->col_dual).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(highs_solution->col_dual).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3))) ||
     (num_row !=
      (int)((ulong)((long)(highs_solution->row_dual).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(highs_solution->row_dual).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3))) {
    y_start = (double *)0x0;
    highsLogUser(log_options_,kInfo,"Calling IPX crossover with only primal values\n");
    z_start = (double *)0x0;
  }
  else {
    highsLogUser(log_options_,kInfo,"Calling IPX crossover with primal and dual values\n");
    z_start = (highs_solution->col_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_start;
    y_start = (highs_solution->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_start;
  }
  uVar7 = ipx::LpSolver::CrossoverFromStartingPoint
                    (&lps,x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                     slack.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,y_start,z_start);
  if (uVar7 == 0) {
    ipx::LpSolver::GetInfo(&ipx_info,&lps);
    pHVar1 = &(local_1000->super_HighsInfoStruct).crossover_iteration_count;
    *pHVar1 = *pHVar1 + ipx_info.super_ipx_info.updates_crossover;
    if (ipx_info.super_ipx_info.status_crossover - 1U < 2) {
      memset(&ipx_solution.ipx_col_value,0,0x90);
      ipx_solution.num_col = num_col;
      ipx_solution.num_row = num_row;
      std::vector<double,_std::allocator<double>_>::resize
                (&ipx_solution.ipx_col_value,(long)num_col);
      std::vector<double,_std::allocator<double>_>::resize
                (&ipx_solution.ipx_row_value,(long)num_row);
      std::vector<double,_std::allocator<double>_>::resize(&ipx_solution.ipx_col_dual,(long)num_col)
      ;
      std::vector<double,_std::allocator<double>_>::resize(&ipx_solution.ipx_row_dual,(long)num_row)
      ;
      std::vector<int,_std::allocator<int>_>::resize(&ipx_solution.ipx_row_status,(long)num_row);
      std::vector<int,_std::allocator<int>_>::resize(&ipx_solution.ipx_col_status,(long)num_col);
      uVar7 = ipx::LpSolver::GetBasicSolution
                        (&lps,ipx_solution.ipx_col_value.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start,
                         ipx_solution.ipx_row_value.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         ipx_solution.ipx_row_dual.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         ipx_solution.ipx_col_dual.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         ipx_solution.ipx_row_status.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                         ipx_solution.ipx_col_status.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start);
      if (uVar7 == 0) {
        HVar8 = ipxBasicSolutionToHighsBasicSolution
                          (log_options_,lp,&rhs,&constraint_type,&ipx_solution,local_1010,
                           highs_solution);
        if (HVar8 != kOk) {
          highsLogUser(log_options_,kError,
                       "Failed to convert IPX basic solution to Highs basic solution\n",
                       highs_solution);
          goto LAB_0031f87a;
        }
        HVar8 = (HighsStatus)(ipx_info.super_ipx_info.status_crossover == 2);
        (local_1000->super_HighsInfoStruct).basis_validity = (uint)local_1010->valid;
        *local_1008 = (uint)(ipx_info.super_ipx_info.status_crossover == 2) * 8 + kOptimal;
      }
      else {
        highsLogUser(log_options_,kError,"IPX crossover getting basic solution: flag = %d\n",
                     (ulong)uVar7);
LAB_0031f87a:
        HVar8 = kError;
      }
      IpxSolution::~IpxSolution(&ipx_solution);
    }
    else {
      if (ipx_info.super_ipx_info.status_crossover != 6) {
        highsLogUser(log_options_,kError,"IPX crossover failed: status = %d\n",
                     (ulong)(uint)ipx_info.super_ipx_info.status_crossover);
        goto LAB_0031f6dc;
      }
      *local_1008 = kTimeLimit;
    }
  }
  else {
    highsLogUser(log_options_,kError,"IPX crossover error: flag = %d\n",(ulong)uVar7);
LAB_0031f6dc:
    HVar8 = kError;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&slack.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&x.super__Vector_base<double,_std::allocator<double>_>);
LAB_0031f8a2:
  ipx::LpSolver::~LpSolver(&lps);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&constraint_type.super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&rhs.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&Av.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&col_ub.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&col_lb.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&objective.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&Ai.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&Ap.super__Vector_base<int,_std::allocator<int>_>);
  return HVar8;
}

Assistant:

HighsStatus callCrossover(const HighsOptions& options, const HighsLp& lp,
                          HighsBasis& highs_basis,
                          HighsSolution& highs_solution,
                          HighsModelStatus& model_status, HighsInfo& highs_info,
                          HighsCallback& highs_callback) {
  ipx::Int num_col, num_row;
  double offset;
  std::vector<ipx::Int> Ap, Ai;
  std::vector<double> objective, col_lb, col_ub, Av, rhs;
  std::vector<char> constraint_type;

  fillInIpxData(lp, num_col, num_row, offset, objective, col_lb, col_ub, Ap, Ai,
                Av, rhs, constraint_type);
  // if (res != IpxStatus::OK) return HighsStatus::kError;

  const HighsLogOptions& log_options = options.log_options;

  ipx::Parameters parameters;
  parameters.run_crossover = 1;  // 1 = "on"
  parameters.crash_basis = 1;    // 0 = slack basis; 1 = crash basis
  parameters.display = 1;
  if (!options.output_flag) parameters.display = 0;
  // Modify parameters.debug according to log_dev_level
  parameters.debug = 0;
  if (options.log_dev_level == kHighsLogDevLevelDetailed) {
    // Default options.log_dev_level setting is kHighsLogDevLevelNone, yielding
    // default setting debug = 0
  } else if (options.log_dev_level == kHighsLogDevLevelInfo) {
    parameters.debug = 2;
  } else if (options.log_dev_level == kHighsLogDevLevelVerbose) {
    parameters.debug = 4;
  }
  parameters.highs_logging = true;
  parameters.log_options = &options.log_options;

  ipx::LpSolver lps;
  lps.SetParameters(parameters);

  // Set pointer to any callback
  lps.SetCallback(&highs_callback);

  ipx::Int load_status = lps.LoadModel(
      num_col, offset, objective.data(), col_lb.data(), col_ub.data(), num_row,
      Ap.data(), Ai.data(), Av.data(), rhs.data(), constraint_type.data());
  if (load_status != 0) {
    highsLogUser(log_options, HighsLogType::kError,
                 "Error loading ipx model\n");
    return HighsStatus::kError;
  }

  // Set x values within bounds.
  std::vector<double> x(highs_solution.col_value);
  for (int i = 0; i < num_col; i++) {
    x[i] = std::max(x[i], col_lb[i]);
    x[i] = std::min(x[i], col_ub[i]);
  }

  // Build slack variables from rhs-A*x but subject to sign conditions.
  std::vector<double> slack(rhs);
  for (int i = 0; i < num_col; i++) {
    for (int p = Ap[i]; p < Ap[i + 1]; ++p) slack[Ai[p]] -= Av[p] * x[i];
  }
  for (int i = 0; i < num_row; i++) {
    switch (constraint_type[i]) {
      case '=':
        slack[i] = 0.0;
        break;
      case '<':
        slack[i] = std::max(slack[i], 0.0);
        break;
      case '>':
        slack[i] = std::min(slack[i], 0.0);
        break;
    }
  }
  ipx::Int crossover_status;
  if (highs_solution.dual_valid &&
      (HighsInt)highs_solution.col_dual.size() == num_col &&
      (HighsInt)highs_solution.row_dual.size() == num_row) {
    highsLogUser(log_options, HighsLogType::kInfo,
                 "Calling IPX crossover with primal and dual values\n");
    crossover_status = lps.CrossoverFromStartingPoint(
        x.data(), slack.data(), highs_solution.row_dual.data(),
        highs_solution.col_dual.data());
  } else {
    highsLogUser(log_options, HighsLogType::kInfo,
                 "Calling IPX crossover with only primal values\n");
    crossover_status = lps.CrossoverFromStartingPoint(x.data(), slack.data(),
                                                      nullptr, nullptr);
  }

  if (crossover_status != 0) {
    highsLogUser(log_options, HighsLogType::kError,
                 "IPX crossover error: flag = %d\n", (int)crossover_status);
    return HighsStatus::kError;
  }
  ipx::Info ipx_info = lps.GetInfo();
  highs_info.crossover_iteration_count += (HighsInt)ipx_info.updates_crossover;
  const bool imprecise_solution =
      ipx_info.status_crossover == IPX_STATUS_imprecise;
  if (ipx_info.status_crossover != IPX_STATUS_optimal &&
      ipx_info.status_crossover != IPX_STATUS_imprecise &&
      ipx_info.status_crossover != IPX_STATUS_time_limit) {
    highsLogUser(log_options, HighsLogType::kError,
                 "IPX crossover failed: status = %d\n",
                 (int)ipx_info.status_crossover);
    return HighsStatus::kError;
  }
  if (ipx_info.status_crossover == IPX_STATUS_time_limit) {
    model_status = HighsModelStatus::kTimeLimit;
    return HighsStatus::kWarning;
  }

  // Get basis
  IpxSolution ipx_solution;
  ipx_solution.num_col = num_col;
  ipx_solution.num_row = num_row;
  ipx_solution.ipx_col_value.resize(num_col);
  ipx_solution.ipx_row_value.resize(num_row);
  ipx_solution.ipx_col_dual.resize(num_col);
  ipx_solution.ipx_row_dual.resize(num_row);
  ipx_solution.ipx_row_status.resize(num_row);
  ipx_solution.ipx_col_status.resize(num_col);
  ipx::Int errflag = lps.GetBasicSolution(
      ipx_solution.ipx_col_value.data(), ipx_solution.ipx_row_value.data(),
      ipx_solution.ipx_row_dual.data(), ipx_solution.ipx_col_dual.data(),
      ipx_solution.ipx_row_status.data(), ipx_solution.ipx_col_status.data());
  if (errflag != 0) {
    highsLogUser(log_options, HighsLogType::kError,
                 "IPX crossover getting basic solution: flag = %d\n",
                 (int)errflag);
    return HighsStatus::kError;
  }

  // Convert the IPX basic solution to a HiGHS basic solution
  HighsStatus status = ipxBasicSolutionToHighsBasicSolution(
      options.log_options, lp, rhs, constraint_type, ipx_solution, highs_basis,
      highs_solution);

  if (status != HighsStatus::kOk) {
    highsLogUser(
        log_options, HighsLogType::kError,
        "Failed to convert IPX basic solution to Highs basic solution\n");
    return HighsStatus::kError;
  }
  highs_info.basis_validity =
      highs_basis.valid ? kBasisValidityValid : kBasisValidityInvalid;
  HighsStatus return_status;
  if (imprecise_solution) {
    model_status = HighsModelStatus::kUnknown;
    return_status = HighsStatus::kWarning;
  } else {
    model_status = HighsModelStatus::kOptimal;
    return_status = HighsStatus::kOk;
  }
  return return_status;
}